

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

void __thiscall
mp::BasicExprFactory<std::allocator<char>_>::PLTermBuilder::AddSlope
          (PLTermBuilder *this,double slope)

{
  double slope_local;
  PLTermBuilder *this_local;
  
  this->impl_->data[this->slope_index_ << 1] = slope;
  this->slope_index_ = this->slope_index_ + 1;
  return;
}

Assistant:

void AddSlope(double slope) {
      MP_ASSERT(slope_index_ < impl_->num_breakpoints + 1, "too many slopes");
      impl_->data[2 * slope_index_] = slope;
      ++slope_index_;
    }